

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pthread.cpp
# Opt level: O1

void __thiscall booster::fork_shared_mutex::unlock(fork_shared_mutex *this)

{
  int iVar1;
  int *piVar2;
  flock lock;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  uStack_30 = 0;
  local_28 = 0;
  uStack_20 = 0;
  local_38 = 2;
  do {
    iVar1 = fileno((FILE *)((this->d).ptr_)->lock_file);
    iVar1 = fcntl(iVar1,7,&local_38);
    if (iVar1 == 0) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  pthread_rwlock_unlock((pthread_rwlock_t *)(this->d).ptr_);
  return;
}

Assistant:

void fork_shared_mutex::unlock()
	{
		struct flock lock;
		memset(&lock,0,sizeof(lock));
		lock.l_type=F_UNLCK;
		lock.l_whence=SEEK_SET;
		int res = 0;
		while((res = ::fcntl(fileno(d->lock_file),F_SETLKW,&lock))!=0 && errno==EINTR)
			;
		pthread_rwlock_unlock(&d->lock);
	}